

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O1

int main(int argc,char **argv)

{
  __u8 *p_Var1;
  bool bVar2;
  __time_t _Var3;
  __suseconds_t _Var4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  undefined8 uVar12;
  long lVar13;
  long *plVar14;
  size_t sVar15;
  char **__src;
  undefined8 unaff_R12;
  int iVar16;
  char *pcVar17;
  long lVar18;
  timeval timeo;
  sockaddr_can addr;
  timeval start_tv;
  fd_set rdfs;
  char acStack_210 [48];
  undefined1 uStack_1e0;
  char acStack_1df [9];
  byte bStack_1d6;
  char acStack_1d4 [140];
  ulong uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  char **ppcStack_130;
  char *pcStack_128;
  code *pcStack_120;
  uint local_10c;
  timeval local_108;
  long local_f8;
  timeval local_f0;
  sockaddr local_e0;
  timeval local_c8;
  fd_set local_b8;
  
  pcStack_120 = (code *)0x101575;
  signal(0xf,sigterm);
  pcStack_120 = (code *)0x101582;
  signal(1,sigterm);
  pcStack_120 = (code *)0x10158f;
  signal(2,sigterm);
  lVar9 = 0;
  do {
    p_Var1 = sniftab[0].last.data + lVar9 + -0x40;
    *p_Var1 = *p_Var1 | 1;
    lVar9 = lVar9 + 0x158;
  } while (lVar9 != 0xac000);
  pcVar17 = "r:t:h:l:f:qeb8Bc?";
  uVar5 = 0;
switchD_001015e4_caseD_f:
  uVar12 = uVar5;
  pcStack_120 = (code *)0x1015cd;
  uVar6 = getopt(argc,argv,"r:t:h:l:f:qeb8Bc?");
  if (0x41 < (int)uVar6) {
    uVar7 = uVar6 - 0x62;
    if (0x12 < uVar7) {
      if (uVar6 == 0x42) {
        binary = 1;
        binary_gap = 1;
        uVar5 = uVar12;
      }
      else {
switchD_001015e4_caseD_2:
        pcStack_120 = (code *)0x101742;
        fprintf(_stderr,"Unknown option %c\n",(ulong)uVar6);
        uVar5 = uVar12;
      }
      goto switchD_001015e4_caseD_f;
    }
    uVar5 = CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
    switch(uVar7) {
    case 0:
      goto LAB_00101614;
    case 1:
      color = 1;
      uVar5 = uVar12;
      goto switchD_001015e4_caseD_f;
    default:
      goto switchD_001015e4_caseD_2;
    case 3:
      print_eff = 1;
      uVar5 = uVar12;
      goto switchD_001015e4_caseD_f;
    case 4:
      pcStack_120 = (code *)0x101678;
      __isoc99_sscanf(_optarg,"%ld",&canfd_mode);
      uVar5 = uVar12;
      if (1 < (ulong)canfd_mode) {
        canfd_mode = 2;
      }
      goto switchD_001015e4_caseD_f;
    case 6:
      plVar14 = &hold;
      break;
    case 10:
      plVar14 = &loop;
      break;
    case 0xf:
      goto switchD_001015e4_caseD_f;
    case 0x10:
      goto switchD_001015e4_caseD_10;
    case 0x12:
      plVar14 = &timeout;
    }
    pcStack_120 = (code *)0x101712;
    __isoc99_sscanf(_optarg,"%ld",plVar14);
    uVar5 = uVar12;
    goto switchD_001015e4_caseD_f;
  }
  if (uVar6 == 0x38) {
    binary8 = 1;
    vdl = "|";
LAB_00101614:
    binary = 1;
    binary_gap = 0;
    uVar5 = uVar12;
    goto switchD_001015e4_caseD_f;
  }
  if (uVar6 != 0xffffffff) {
    if (uVar6 != 0x3f) goto switchD_001015e4_caseD_2;
    pcStack_120 = (code *)0x101aa3;
    main_cold_1();
    goto LAB_00101aa3;
  }
  pcVar17 = &optind;
  lVar9 = (long)_optind;
  if (_optind == argc) goto LAB_00101aa8;
  if ((char)uVar12 != '\0') {
    lVar13 = 0;
    do {
      p_Var1 = sniftab[0].last.data + lVar13 + -0x40;
      *p_Var1 = *p_Var1 & 0xfe;
      lVar13 = lVar13 + 0x158;
    } while (lVar13 != 0xac000);
  }
  pcVar17 = argv[lVar9];
  pcStack_120 = (code *)0x10178a;
  sVar15 = strlen(pcVar17);
  if (sVar15 < 0x10) {
    pcStack_120 = (code *)0x1017cb;
    interface = pcVar17;
    local_10c = socket(0x1d,3,1);
    if ((int)local_10c < 0) {
      pcStack_120 = (code *)0x101a71;
      perror("socket");
      return 1;
    }
    local_e0.sa_family = 0x1d;
    local_e0.sa_data[2] = '\0';
    local_e0.sa_data[3] = '\0';
    local_e0.sa_data[4] = '\0';
    local_e0.sa_data[5] = '\0';
    pcVar17 = argv[_optind];
    pcStack_120 = (code *)0x1017fc;
    iVar8 = strcmp("any",pcVar17);
    if (iVar8 != 0) {
      pcStack_120 = (code *)0x101808;
      local_e0.sa_data._2_4_ = if_nametoindex(pcVar17);
      if (local_e0.sa_data._2_4_ == 0) {
        pcStack_120 = (code *)0x101a7f;
        perror("if_nametoindex");
        goto LAB_001017a1;
      }
    }
    if (canfd_mode != 0) {
      local_b8.fds_bits[0] = CONCAT44(local_b8.fds_bits[0]._4_4_,1);
      pcStack_120 = (code *)0x101842;
      iVar8 = setsockopt(local_10c,0x65,5,&local_b8,4);
      if (iVar8 == 0) {
        max_dlen = '\x01';
        name_sep = 1;
        print_ascii = 0;
      }
      else {
        pcStack_120 = (code *)0x101855;
        puts("error when enabling CAN FD support");
      }
      if (iVar8 != 0) {
        return (uint)(iVar8 != 0);
      }
    }
    pcStack_120 = (code *)0x101892;
    iVar8 = bind(local_10c,&local_e0,0x18);
    if (iVar8 < 0) {
      pcStack_120 = (code *)0x101a90;
      perror("bind");
      pcStack_120 = (code *)0x101a99;
      close(local_10c);
    }
    else {
      pcStack_120 = (code *)0x1018a8;
      gettimeofday(&local_c8,(__timezone_ptr_t)0x0);
      local_108.tv_sec = 0;
      local_108.tv_usec = 0;
      pcStack_120 = (code *)0x1018c5;
      printf("%s","\x1b[?25l");
      if (running != 0) {
        uVar11 = 1L << ((byte)local_10c & 0x3f);
        uVar6 = local_10c >> 6;
        iVar16 = local_10c + 1;
        local_f8 = local_c8.tv_sec;
        lVar9 = 0;
        do {
          local_b8.fds_bits[1] = 0;
          local_b8.fds_bits[0xe] = 0;
          local_b8.fds_bits[0xf] = 0;
          local_b8.fds_bits[0xc] = 0;
          local_b8.fds_bits[0xd] = 0;
          local_b8.fds_bits[10] = 0;
          local_b8.fds_bits[0xb] = 0;
          local_b8.fds_bits[8] = 0;
          local_b8.fds_bits[9] = 0;
          local_b8.fds_bits[6] = 0;
          local_b8.fds_bits[7] = 0;
          local_b8.fds_bits[4] = 0;
          local_b8.fds_bits[5] = 0;
          local_b8.fds_bits[2] = 0;
          local_b8.fds_bits[3] = 0;
          local_b8.fds_bits[0] = 1;
          local_b8.fds_bits[uVar6] = local_b8.fds_bits[uVar6] | uVar11;
          local_f0.tv_sec = 0;
          local_f0.tv_usec = loop * 10000;
          pcStack_120 = (code *)0x101973;
          iVar8 = select(iVar16,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_f0);
          if (iVar8 < 0) {
            running = 0;
            goto LAB_00101a21;
          }
          pcStack_120 = (code *)0x101987;
          gettimeofday(&local_108,(__timezone_ptr_t)0x0);
          _Var4 = local_108.tv_usec;
          _Var3 = local_108.tv_sec;
          if ((local_b8.fds_bits[0] & 1U) != 0) {
            pcStack_120 = (code *)0x1019aa;
            uVar7 = handle_keyb();
            running = running & uVar7;
          }
          lVar13 = _Var4 / 10000 + (_Var3 - local_f8) * 100;
          if ((local_b8.fds_bits[uVar6] & uVar11) != 0) {
            pcStack_120 = (code *)0x1019dd;
            uVar7 = handle_frame(local_10c,lVar13);
            running = running & uVar7;
          }
          if (loop <= lVar13 - lVar9) {
            pcStack_120 = (code *)0x1019fa;
            handle_timeo(lVar13);
            running = running & 1;
            lVar9 = lVar13;
          }
        } while (running != 0);
        iVar8 = 0;
      }
LAB_00101a21:
      pcStack_120 = (code *)0x101a36;
      printf("%s","\x1b[?25h");
      pcStack_120 = (code *)0x101a3f;
      close(local_10c);
      if (signal_num != 0) {
        iVar8 = signal_num + 0x80;
      }
    }
  }
  else {
    pcStack_120 = (code *)0x1017a1;
    printf("name of CAN device \'%s\' is too long!\n",pcVar17);
LAB_001017a1:
    iVar8 = 1;
  }
  return iVar8;
switchD_001015e4_caseD_10:
  pcStack_120 = (code *)0x1016e3;
  iVar8 = readsettings(_optarg);
  uVar5 = uVar12;
  if (iVar8 < 0) goto LAB_00101aa3;
  goto switchD_001015e4_caseD_f;
LAB_00101aa3:
  pcStack_120 = (code *)0x101aa8;
  main_cold_2();
LAB_00101aa8:
  pcStack_120 = readsettings;
  __src = argv;
  main_cold_3();
  pcStack_120 = (code *)&switchD_001015e4::switchdataD_00103004;
  uStack_148 = (ulong)(uint)argc;
  uStack_140 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  uStack_138 = uVar12;
  ppcStack_130 = argv;
  pcStack_128 = pcVar17;
  memset(&uStack_1e0,0,0x8e);
  if (canfd_mode == 1) {
    builtin_strncpy(acStack_210 + 8,"_fd.",5);
    sVar15 = 0x8d;
  }
  else {
    if (canfd_mode != 0) {
      puts("readsettings failed due to unspecified CAN FD mode");
      return -1;
    }
    acStack_210[8] = '.';
    acStack_210[9] = '\0';
    sVar15 = 0x1d;
  }
  builtin_strncpy(acStack_210,"sniffset",8);
  sVar10 = strlen(acStack_210);
  strncat(acStack_210,(char *)__src,0x28 - sVar10);
  iVar8 = open(acStack_210,0);
  if (iVar8 < 1) {
    return -1;
  }
  idx = 0;
  do {
    sVar10 = read(iVar8,&uStack_1e0,sVar15);
    if (sVar10 != sVar15) break;
    uVar11 = strtoul(acStack_1df,(char **)0x0,0x10);
    lVar13 = (long)idx;
    sniftab[lVar13].current.can_id = (canid_t)uVar11;
    lVar9 = 7;
    if (max_dlen != '\0') {
      lVar9 = 0x3f;
    }
    sniftab[lVar13].flags = sniftab[lVar13].flags & 0xfffffffeU | bStack_1d6 & 1;
    pcVar17 = acStack_1d4 + lVar9 * 2;
    lVar13 = lVar9 + 0x106298;
    lVar9 = lVar9 + 1;
    do {
      uVar11 = strtoul(pcVar17,(char **)0x0,0x10);
      *(char *)(lVar13 + (long)idx * 0x158) = (char)uVar11;
      *pcVar17 = '\0';
      pcVar17 = pcVar17 + -2;
      lVar13 = lVar13 + -1;
      lVar18 = lVar9 + -1;
      bVar2 = 0 < lVar9;
      lVar9 = lVar18;
    } while (lVar18 != 0 && bVar2);
    iVar16 = idx + 1;
    bVar2 = idx < 0x7ff;
    idx = iVar16;
  } while (bVar2);
  close(iVar8);
  return idx;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int s;
	long currcms = 0;
	long lastcms = 0;
	unsigned char quiet = 0;
	int opt, ret = 0;
	struct timeval timeo, start_tv, tv;
	struct sockaddr_can addr;
	int i;

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	for (i = 0; i < MAX_SLOTS ;i++) /* default: enable all slots */
		do_set(i, ENABLE);

	while ((opt = getopt(argc, argv, "r:t:h:l:f:qeb8Bc?")) != -1) {
		switch (opt) {
		case 'r':
			if (readsettings(optarg) < 0) {
				fprintf(stderr, "Unable to read setting file '%s%s'!\n", SETFNAME, optarg);
				exit(1);
			}
			break;

		case 't':
			sscanf(optarg, "%ld", &timeout);
			break;

		case 'h':
			sscanf(optarg, "%ld", &hold);
			break;

		case 'l':
			sscanf(optarg, "%ld", &loop);
			break;

		case 'f':
			sscanf(optarg, "%ld", &canfd_mode);
			if ((canfd_mode != CANFD_ON) && (canfd_mode != CANFD_OFF))
				canfd_mode = CANFD_AUTO;
			break;

		case 'q':
			quiet = 1;
			break;

		case 'e':
			print_eff = 1;
			break;

		case 'b':
			binary = 1;
			binary_gap = 0;
			break;

		case '8':
			binary = 1;
			binary8 = 1; /* enable variable delimiter for EFF */
			switchvdl(SDL); /* switch directly to short delimiter */
			binary_gap = 0;
			break;

		case 'B':
			binary = 1;
			binary_gap = 1;
			break;

		case 'c':
			color = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			break;
		}
	}

	if (optind == argc) {
		print_usage(basename(argv[0]));
		exit(0);
	}

	if (quiet)
		for (i = 0; i < MAX_SLOTS; i++)
			do_clr(i, ENABLE);

	if (strlen(argv[optind]) >= IFNAMSIZ) {
		printf("name of CAN device '%s' is too long!\n", argv[optind]);
		return 1;
	}

	interface = argv[optind];

	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = 0; /* 'any' CAN interface */

	/* check for specific CAN interface */
	if (strcmp(ANYDEV, argv[optind]) != 0) {
		addr.can_ifindex = if_nametoindex(argv[optind]);
		if (!addr.can_ifindex) {
			perror("if_nametoindex");
			return 1;
		}
	}

	/* enable CAN FD if not disabled by command line option */
	if (canfd_mode != CANFD_OFF) {
		const int enable_canfd = 1;

		if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES,
			       &enable_canfd, sizeof(enable_canfd))){
			printf("error when enabling CAN FD support\n");
			return 1;
		}

		/* might be changed in CANFD_AUTO mode */
		max_dlen = CANFD_MAX_DLEN;
		name_sep = FD_SEP;
		print_ascii = 0; /* don't print ASCII for CAN FD by default */
	}

	ret = bind(s, (struct sockaddr *)&addr, sizeof(addr));
	if (ret < 0) {
		perror("bind");
		close(s);
		return ret;
	}

	gettimeofday(&start_tv, NULL);
	tv.tv_sec = tv.tv_usec = 0;

	printf("%s", CSR_HIDE); /* hide cursor */

	while (running) {

		FD_ZERO(&rdfs);
		FD_SET(0, &rdfs);
		FD_SET(s, &rdfs);

		timeo.tv_sec  = 0;
		timeo.tv_usec = 10000 * loop;

		ret = select(s+1, &rdfs, NULL, NULL, &timeo);
		if (ret < 0) {
			//perror("select");
			running = 0;
			continue;
		} else
			ret = 0;

		gettimeofday(&tv, NULL);
		currcms = (tv.tv_sec - start_tv.tv_sec) * 100 + (tv.tv_usec / 10000);

		if (FD_ISSET(0, &rdfs))
			running &= handle_keyb();

		if (FD_ISSET(s, &rdfs))
			running &= handle_frame(s, currcms);

		if (currcms - lastcms >= loop) {
			running &= handle_timeo(currcms);
			lastcms = currcms;
		}
	}

	printf("%s", CSR_SHOW); /* show cursor */

	close(s);

	if (signal_num)
		return 128 + signal_num;

	return ret;
}